

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall
TPZEqnArray<std::complex<double>_>::Read(TPZEqnArray<std::complex<double>_> *this,FILE *inputfile)

{
  void *__ptr;
  int *piVar1;
  uint in_EAX;
  size_t sVar2;
  int aux;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  fread(&this->fNumEq,4,1,(FILE *)inputfile);
  fread(&this->fLastTerm,4,1,(FILE *)inputfile);
  __ptr = (void *)((long)&uStack_28 + 4);
  uStack_28 = (ulong)(uint)uStack_28;
  fread(__ptr,4,1,(FILE *)inputfile);
  sVar2 = (size_t)uStack_28._4_4_;
  TPZManVector<int,_100>::Resize(&(this->fEqStart).super_TPZManVector<int,_100>,sVar2);
  fread((this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,4,sVar2,
        (FILE *)inputfile);
  fread(__ptr,4,1,(FILE *)inputfile);
  sVar2 = (size_t)uStack_28._4_4_;
  TPZManVector<int,_100>::Resize(&(this->fEqNumber).super_TPZManVector<int,_100>,sVar2);
  fread((this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,4,sVar2,
        (FILE *)inputfile);
  fread(__ptr,4,1,(FILE *)inputfile);
  sVar2 = (size_t)uStack_28._4_4_;
  TPZManVector<int,_1000>::Resize(&(this->fIndex).super_TPZManVector<int,_1000>,sVar2);
  fread((this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore,4,sVar2,
        (FILE *)inputfile);
  fread(__ptr,4,1,(FILE *)inputfile);
  sVar2 = (size_t)uStack_28._4_4_;
  TPZManVector<std::complex<double>,_1000>::Resize
            (&(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>,sVar2);
  fread((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
        super_TPZVec<std::complex<double>_>.fStore,8,sVar2,(FILE *)inputfile);
  this->fSymmetric = EIsSymmetric;
  if (((this->fNumEq & 1U) == 0 && this->fNumEq != 0) &&
     (piVar1 = (this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,
     *piVar1 == piVar1[1])) {
    this->fSymmetric = EIsNonSymmetric;
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::Read(FILE * inputfile) {
	int64_t sizereturn;
	sizereturn = 0;
	/** Number of equations */
	sizereturn = fread(&fNumEq,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	/** Last term added*/
	sizereturn = fread(&fLastTerm,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	int aux=0;
	/** TPZStack fEqStart data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fEqStart.Resize(aux);
	sizereturn = fread(&fEqStart[0],sizeof(int), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	/** TPZStack fEqNumber data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fEqNumber.Resize(aux);
	sizereturn = fread(&fEqNumber[0],sizeof(int), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	/** TPZStack fIndex data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fIndex.Resize(aux);
	sizereturn = fread(&fIndex[0],sizeof(int), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	/** TPZStack fEqValues data */
	sizereturn = fread(&aux,sizeof(int),1,inputfile);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	fEqValues.Resize(aux);
	sizereturn = fread(&fEqValues[0],sizeof(REAL), aux ,inputfile);
#ifdef PZDEBUG
	if (sizereturn != aux) DebugStop();
#endif
	
	this->fSymmetric = EIsSymmetric;
	if(fNumEq && fNumEq%2==0 && fEqNumber[0]==fEqNumber[1]) fSymmetric = EIsNonSymmetric;
}